

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_counted_impl.hpp
# Opt level: O1

void __thiscall
boost::detail::
sp_counted_impl_p<boost::spirit::classic::impl::object_with_id_base_supply<unsigned_long>_>::dispose
          (sp_counted_impl_p<boost::spirit::classic::impl::object_with_id_base_supply<unsigned_long>_>
           *this)

{
  object_with_id_base_supply<unsigned_long> *poVar1;
  pointer puVar2;
  
  poVar1 = this->px_;
  if (poVar1 != (object_with_id_base_supply<unsigned_long> *)0x0) {
    puVar2 = (poVar1->free_ids).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (puVar2 != (pointer)0x0) {
      operator_delete(puVar2,(long)(poVar1->free_ids).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2
                     );
    }
    operator_delete(poVar1,0x20);
    return;
  }
  return;
}

Assistant:

virtual void dispose() // nothrow
    {
#if defined(BOOST_SP_ENABLE_DEBUG_HOOKS)
        boost::sp_scalar_destructor_hook( px_, sizeof(X), this );
#endif
        boost::checked_delete( px_ );
    }